

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

void __thiscall QUrlQuery::QUrlQuery(QUrlQuery *this,QString *queryString)

{
  QUrlQueryPrivate *this_00;
  
  if ((queryString->d).size == 0) {
    (this->d).d.ptr = (QUrlQueryPrivate *)0x0;
  }
  else {
    this_00 = (QUrlQueryPrivate *)operator_new(0x28);
    QUrlQueryPrivate::QUrlQueryPrivate(this_00,queryString);
    (this->d).d.ptr = this_00;
    LOCK();
    (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  return;
}

Assistant:

QUrlQuery::QUrlQuery(const QString &queryString)
    : d(queryString.isEmpty() ? nullptr : new QUrlQueryPrivate(queryString))
{
}